

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int analyzeAggregate(Walker *pWalker,Expr *pExpr)

{
  u8 uVar1;
  short sVar2;
  NameContext *pNVar3;
  Parse *pPVar4;
  SrcList *pSVar5;
  AggInfo *pAVar6;
  ExprList *pEVar7;
  Expr *pEVar8;
  uint uVar9;
  int *piVar10;
  AggInfo_col *pAVar11;
  AggInfo_func *pAVar12;
  FuncDef *pFVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  ExprList_item *pEVar18;
  int iVar19;
  bool bVar20;
  int local_38;
  int local_34;
  
  pNVar3 = (pWalker->u).pNC;
  pPVar4 = pNVar3->pParse;
  pSVar5 = pNVar3->pSrcList;
  pAVar6 = pNVar3->pAggInfo;
  uVar1 = pExpr->op;
  if (uVar1 != 0x9a) {
    if (uVar1 == 0x99) {
      if ((pNVar3->ncFlags & 8) != 0) {
        return 0;
      }
      if (pWalker->walkerDepth != (uint)pExpr->op2) {
        return 0;
      }
      pAVar12 = pAVar6->aFunc;
      piVar10 = &pAVar6->nFunc;
      uVar16 = 0;
      iVar14 = -1;
      do {
        iVar19 = *piVar10;
        iVar17 = (int)uVar16;
        if (iVar19 <= iVar17) {
LAB_00265a27:
          if (iVar19 <= iVar17) {
            uVar1 = pPVar4->db->enc;
            pAVar12 = (AggInfo_func *)
                      sqlite3ArrayAllocate(pPVar4->db,pAVar6->aFunc,0x18,piVar10,&local_34);
            pAVar6->aFunc = pAVar12;
            uVar16 = (ulong)local_34;
            if (-1 < (long)uVar16) {
              pAVar12[uVar16].pExpr = pExpr;
              iVar19 = pPVar4->nMem + 1;
              pPVar4->nMem = iVar19;
              pAVar12[uVar16].iMem = iVar19;
              if ((pExpr->x).pList == (ExprList *)0x0) {
                iVar19 = 0;
              }
              else {
                iVar19 = ((pExpr->x).pList)->nExpr;
              }
              pFVar13 = sqlite3FindFunction(pPVar4->db,(pExpr->u).zToken,iVar19,uVar1,'\0');
              pAVar12[uVar16].pFunc = pFVar13;
              if ((pExpr->flags & 0x10) != 0) {
                iVar14 = pPVar4->nTab;
                pPVar4->nTab = iVar14 + 1;
              }
              pAVar12[uVar16].iDistinct = iVar14;
            }
          }
          pExpr->iAgg = (i16)uVar16;
          pExpr->pAggInfo = pAVar6;
          return 1;
        }
        iVar19 = sqlite3ExprCompare((Parse *)0x0,pAVar12->pExpr,pExpr,-1);
        if (iVar19 == 0) {
          iVar19 = *piVar10;
          goto LAB_00265a27;
        }
        uVar16 = (ulong)(iVar17 + 1);
        pAVar12 = pAVar12 + 1;
      } while( true );
    }
    if (uVar1 != 0x98) {
      return 0;
    }
  }
  if (pSVar5 != (SrcList *)0x0) {
    iVar14 = 0;
    if (0 < pSVar5->nSrc) {
      iVar14 = pSVar5->nSrc;
    }
    piVar10 = &pSVar5->a[0].iCursor;
    while (bVar20 = iVar14 != 0, iVar14 = iVar14 + -1, bVar20) {
      if (pExpr->iTable == *piVar10) {
        uVar15 = 0;
        uVar9 = pAVar6->nColumn;
        if (pAVar6->nColumn < 1) {
          uVar9 = uVar15;
        }
        piVar10 = &pAVar6->aCol->iColumn;
        goto LAB_0026594c;
      }
      piVar10 = piVar10 + 0x1c;
    }
  }
  return 1;
LAB_0026594c:
  uVar16 = (ulong)uVar15;
  if (uVar9 == uVar15) goto LAB_0026596c;
  if ((piVar10[-1] == pExpr->iTable) && (*piVar10 == (int)pExpr->iColumn)) goto LAB_00265a14;
  uVar15 = uVar15 + 1;
  piVar10 = piVar10 + 8;
  goto LAB_0026594c;
LAB_0026596c:
  pAVar11 = (AggInfo_col *)
            sqlite3ArrayAllocate(pPVar4->db,pAVar6->aCol,0x20,&pAVar6->nColumn,&local_38);
  pAVar6->aCol = pAVar11;
  uVar16 = (ulong)local_38;
  if (-1 < (long)uVar16) {
    pAVar11[uVar16].pTab = pExpr->pTab;
    iVar14 = pExpr->iTable;
    pAVar11[uVar16].iTable = iVar14;
    sVar2 = pExpr->iColumn;
    pAVar11[uVar16].iColumn = (int)sVar2;
    iVar19 = pPVar4->nMem + 1;
    pPVar4->nMem = iVar19;
    pAVar11[uVar16].iMem = iVar19;
    pAVar11[uVar16].pExpr = pExpr;
    pEVar7 = pAVar6->pGroupBy;
    if (pEVar7 != (ExprList *)0x0) {
      iVar19 = pEVar7->nExpr;
      pEVar18 = pEVar7->a;
      iVar17 = 0;
      if (iVar19 < 1) {
        iVar19 = 0;
        iVar17 = 0;
      }
      for (; iVar19 != iVar17; iVar17 = iVar17 + 1) {
        pEVar8 = pEVar18->pExpr;
        if (((pEVar8->op == 0x98) && (pEVar8->iTable == iVar14)) && (pEVar8->iColumn == sVar2))
        goto LAB_00265a11;
        pEVar18 = pEVar18 + 1;
      }
    }
    iVar17 = pAVar6->nSortingColumn;
    pAVar6->nSortingColumn = iVar17 + 1;
LAB_00265a11:
    pAVar11[uVar16].iSorterColumn = iVar17;
  }
LAB_00265a14:
  pExpr->pAggInfo = pAVar6;
  pExpr->op = 0x9a;
  pExpr->iAgg = (i16)uVar16;
  return 1;
}

Assistant:

static int analyzeAggregate(Walker *pWalker, Expr *pExpr){
  int i;
  NameContext *pNC = pWalker->u.pNC;
  Parse *pParse = pNC->pParse;
  SrcList *pSrcList = pNC->pSrcList;
  AggInfo *pAggInfo = pNC->pAggInfo;

  switch( pExpr->op ){
    case TK_AGG_COLUMN:
    case TK_COLUMN: {
      testcase( pExpr->op==TK_AGG_COLUMN );
      testcase( pExpr->op==TK_COLUMN );
      /* Check to see if the column is in one of the tables in the FROM
      ** clause of the aggregate query */
      if( ALWAYS(pSrcList!=0) ){
        struct SrcList_item *pItem = pSrcList->a;
        for(i=0; i<pSrcList->nSrc; i++, pItem++){
          struct AggInfo_col *pCol;
          assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
          if( pExpr->iTable==pItem->iCursor ){
            /* If we reach this point, it means that pExpr refers to a table
            ** that is in the FROM clause of the aggregate query.  
            **
            ** Make an entry for the column in pAggInfo->aCol[] if there
            ** is not an entry there already.
            */
            int k;
            pCol = pAggInfo->aCol;
            for(k=0; k<pAggInfo->nColumn; k++, pCol++){
              if( pCol->iTable==pExpr->iTable &&
                  pCol->iColumn==pExpr->iColumn ){
                break;
              }
            }
            if( (k>=pAggInfo->nColumn)
             && (k = addAggInfoColumn(pParse->db, pAggInfo))>=0 
            ){
              pCol = &pAggInfo->aCol[k];
              pCol->pTab = pExpr->pTab;
              pCol->iTable = pExpr->iTable;
              pCol->iColumn = pExpr->iColumn;
              pCol->iMem = ++pParse->nMem;
              pCol->iSorterColumn = -1;
              pCol->pExpr = pExpr;
              if( pAggInfo->pGroupBy ){
                int j, n;
                ExprList *pGB = pAggInfo->pGroupBy;
                struct ExprList_item *pTerm = pGB->a;
                n = pGB->nExpr;
                for(j=0; j<n; j++, pTerm++){
                  Expr *pE = pTerm->pExpr;
                  if( pE->op==TK_COLUMN && pE->iTable==pExpr->iTable &&
                      pE->iColumn==pExpr->iColumn ){
                    pCol->iSorterColumn = j;
                    break;
                  }
                }
              }
              if( pCol->iSorterColumn<0 ){
                pCol->iSorterColumn = pAggInfo->nSortingColumn++;
              }
            }
            /* There is now an entry for pExpr in pAggInfo->aCol[] (either
            ** because it was there before or because we just created it).
            ** Convert the pExpr to be a TK_AGG_COLUMN referring to that
            ** pAggInfo->aCol[] entry.
            */
            ExprSetVVAProperty(pExpr, EP_NoReduce);
            pExpr->pAggInfo = pAggInfo;
            pExpr->op = TK_AGG_COLUMN;
            pExpr->iAgg = (i16)k;
            break;
          } /* endif pExpr->iTable==pItem->iCursor */
        } /* end loop over pSrcList */
      }
      return WRC_Prune;
    }
    case TK_AGG_FUNCTION: {
      if( (pNC->ncFlags & NC_InAggFunc)==0
       && pWalker->walkerDepth==pExpr->op2
      ){
        /* Check to see if pExpr is a duplicate of another aggregate 
        ** function that is already in the pAggInfo structure
        */
        struct AggInfo_func *pItem = pAggInfo->aFunc;
        for(i=0; i<pAggInfo->nFunc; i++, pItem++){
          if( sqlite3ExprCompare(0, pItem->pExpr, pExpr, -1)==0 ){
            break;
          }
        }
        if( i>=pAggInfo->nFunc ){
          /* pExpr is original.  Make a new entry in pAggInfo->aFunc[]
          */
          u8 enc = ENC(pParse->db);
          i = addAggInfoFunc(pParse->db, pAggInfo);
          if( i>=0 ){
            assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
            pItem = &pAggInfo->aFunc[i];
            pItem->pExpr = pExpr;
            pItem->iMem = ++pParse->nMem;
            assert( !ExprHasProperty(pExpr, EP_IntValue) );
            pItem->pFunc = sqlite3FindFunction(pParse->db,
                   pExpr->u.zToken, 
                   pExpr->x.pList ? pExpr->x.pList->nExpr : 0, enc, 0);
            if( pExpr->flags & EP_Distinct ){
              pItem->iDistinct = pParse->nTab++;
            }else{
              pItem->iDistinct = -1;
            }
          }
        }
        /* Make pExpr point to the appropriate pAggInfo->aFunc[] entry
        */
        assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
        ExprSetVVAProperty(pExpr, EP_NoReduce);
        pExpr->iAgg = (i16)i;
        pExpr->pAggInfo = pAggInfo;
        return WRC_Prune;
      }else{
        return WRC_Continue;
      }
    }
  }
  return WRC_Continue;
}